

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::TagAliasRegistry::expandAliases
          (string *__return_storage_ptr__,TagAliasRegistry *this,string *unexpandedTestSpec)

{
  size_type __n;
  _Base_ptr p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,unexpandedTestSpec);
  for (p_Var1 = (this->m_registry)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_registry)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    __n = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find(__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1),0);
    if (__n != 0xffffffffffffffff) {
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_70,__return_storage_ptr__,0,__n);
      std::operator+(&local_b0,&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var1 + 2));
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_90,__return_storage_ptr__,(long)&(p_Var1[1]._M_parent)->_M_color + __n,
                 0xffffffffffffffff);
      std::operator+(&local_50,&local_b0,&local_90);
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TagAliasRegistry::expandAliases(std::string const &unexpandedTestSpec) const {
    std::string expandedTestSpec = unexpandedTestSpec;
    for (auto const &registryKvp : m_registry) {
      std::size_t pos = expandedTestSpec.find(registryKvp.first);
      if (pos != std::string::npos) {
        expandedTestSpec
            = expandedTestSpec.substr(0, pos) + registryKvp.second.tag + expandedTestSpec.substr(pos + registryKvp.first.size());
      }
    }
    return expandedTestSpec;
  }